

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O1

void sptk::swipe::La(matrix L,vector f,vector fERBs,RealValuedFastFourierTransform *plan,
                    vector<double,_std::allocator<double>_> *fi,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *fo,Buffer *buffer,int w2,int hi,int i)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *real_part_output;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  uint uVar9;
  double *pdVar11;
  double *extraout_RDX_00;
  double *extraout_RDX_02;
  double *pdVar12;
  double *extraout_RDX_03;
  ulong uVar13;
  double *pdVar14;
  double dVar15;
  vector y;
  vector y_00;
  vector y2;
  vector y2_00;
  vector x;
  vector x_00;
  vector x_01;
  vector vVar16;
  vector yr_vector;
  vector yr_vector_00;
  vector yr_vector_01;
  int local_50;
  double *pdVar10;
  double *extraout_RDX;
  double *extraout_RDX_01;
  
  pdVar14 = fERBs.v;
  pdVar8 = f.v;
  uVar9 = f.x;
  real_part_output =
       (fo->
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = RealValuedFastFourierTransform::Run(plan,fi,real_part_output,real_part_output + 1,buffer);
  if (bVar5) {
    pvVar2 = (fo->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data;
    lVar4 = *(long *)&pvVar2[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    vVar16 = makev(w2);
    pdVar10 = vVar16.v;
    uVar6 = vVar16.x;
    if (0 < w2) {
      uVar13 = 0;
      do {
        dVar15 = *(double *)(lVar3 + uVar13 * 8);
        dVar1 = *(double *)(lVar4 + uVar13 * 8);
        dVar15 = dVar15 * dVar15 + dVar1 * dVar1;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        pdVar10[uVar13] = dVar15;
        uVar13 = uVar13 + 1;
      } while ((uint)w2 != uVar13);
    }
    x._4_4_ = 0;
    x.x = uVar9;
    vVar16._4_4_ = 0;
    vVar16.x = uVar6;
    vVar16.v = pdVar10;
    x.v = pdVar8;
    vVar16 = spline(x,vVar16);
    pdVar11 = vVar16.v;
    x_00._4_4_ = 0;
    x_00.x = uVar9;
    y._4_4_ = 0;
    y.x = uVar6;
    uVar7 = vVar16.x;
    y2._4_4_ = 0;
    y2.x = uVar7;
    y.v = pdVar10;
    y2.v = pdVar11;
    x_00.v = pdVar8;
    dVar15 = splinv(x_00,y,y2,*pdVar14,hi);
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
      pdVar12 = extraout_RDX_00;
    }
    else {
      dVar15 = SQRT(dVar15);
      pdVar12 = extraout_RDX;
    }
    *L.m[i] = (double)(-(ulong)!NAN(dVar15) & (ulong)dVar15);
    local_50 = L.y;
    if (1 < local_50) {
      uVar13 = 1;
      do {
        yr_vector.v._0_4_ = hi;
        yr_vector._0_8_ = pdVar8;
        yr_vector.v._4_4_ = 0;
        hi = bilookv((swipe *)(ulong)uVar9,yr_vector,pdVar14[uVar13],i);
        x_01._4_4_ = 0;
        x_01.x = uVar9;
        y_00._4_4_ = 0;
        y_00.x = uVar6;
        y2_00._4_4_ = 0;
        y2_00.x = uVar7;
        y_00.v = pdVar10;
        y2_00.v = pdVar11;
        x_01.v = pdVar8;
        dVar15 = splinv(x_01,y_00,y2_00,pdVar14[uVar13],hi);
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
          pdVar12 = extraout_RDX_02;
        }
        else {
          dVar15 = SQRT(dVar15);
          pdVar12 = extraout_RDX_01;
        }
        L.m[i][uVar13] = (double)(-(ulong)!NAN(dVar15) & (ulong)dVar15);
        uVar13 = uVar13 + 1;
      } while (L._0_8_ >> 0x20 != uVar13);
    }
    yr_vector_00.v = pdVar12;
    yr_vector_00._0_8_ = pdVar10;
    freev((swipe *)(ulong)uVar6,yr_vector_00);
    yr_vector_01.v = extraout_RDX_03;
    yr_vector_01._0_8_ = pdVar11;
    freev((swipe *)(ulong)uVar7,yr_vector_01);
    return;
  }
  return;
}

Assistant:

void La(matrix L, vector f, vector fERBs,
                  const sptk::RealValuedFastFourierTransform& plan,
                  const std::vector<double>& fi,
                  std::vector<std::vector<double> >* fo,
                  sptk::RealValuedFastFourierTransform::Buffer* buffer,
                  int w2, int hi, int i) {
    int j;
    if (!plan.Run(fi, &((*fo)[0]), &((*fo)[1]), buffer))
        return;
    double* fo0 = &(((*fo)[0])[0]);
    double* fo1 = &(((*fo)[1])[0]);
    vector a = makev(w2);
    for (j = 0; j < w2; j++) // this iterates over only the first half
        a.v[j] = sqrt(fo0[j] * fo0[j] + fo1[j] * fo1[j]);
#endif
    vector a2 = spline(f, a); // a2 is now the result of the cubic spline
    L.m[i][0] = fixnan(sqrt(splinv(f, a, a2, fERBs.v[0], hi)));
    for (j = 1; j < L.y; j++) { // perform a bisection query at ERB intvls
        hi = bilookv(f, fERBs.v[j], hi); 
        L.m[i][j] = fixnan(sqrt(splinv(f, a, a2, fERBs.v[j], hi)));
    }
    freev(a); 
    freev(a2);
}